

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-matchers.h
# Opt level: O0

void __thiscall testing::Matcher<const_char_&>::Matcher(Matcher<const_char_&> *this,char *value)

{
  ComparisonBase<testing::internal::EqMatcher<char>,_char,_testing::internal::AnyEq> local_31;
  Matcher<const_char_&> local_30;
  char *local_18;
  char *value_local;
  Matcher<const_char_&> *this_local;
  
  local_18 = value;
  value_local = (char *)this;
  internal::MatcherBase<const_char_&>::MatcherBase(&this->super_MatcherBase<const_char_&>);
  (this->super_MatcherBase<const_char_&>).super_MatcherDescriberInterface.
  _vptr_MatcherDescriberInterface = (_func_int **)&PTR__Matcher_002ada18;
  local_31.rhs_ = (char)Eq<char>(*local_18);
  Matcher<char_const&>::Matcher<testing::internal::EqMatcher<char>,void>
            ((Matcher<char_const&> *)&local_30,(EqMatcher<char> *)&local_31);
  operator=(this,&local_30);
  ~Matcher(&local_30);
  return;
}

Assistant:

Matcher<T>::Matcher(T value) { *this = Eq(value); }